

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::GradX<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *xiInterior,TPZFMatrix<Fad<double>_> *gradx)

{
  double dVar1;
  TPZGeoMesh *mesh;
  bool bVar2;
  double *pdVar3;
  Fad<double> *pFVar4;
  Fad<double> *this_00;
  int iNode;
  long lVar5;
  int i;
  int x;
  long lVar6;
  Fad<double> local_1950;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradLinSideVec;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradNonLinSideVec;
  TPZFNMatrix<27,_Fad<double>_> dCorrFactorDxi;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<9,_Fad<double>_> dPhiDxi;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZFNMatrix<45,_Fad<double>_> gradXLin;
  TPZManVector<Fad<double>,_20> blendFactor;
  
  mesh = this->fGeoEl->fMesh;
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(gradx,3,1);
  if (this->fNeighbours[0].fGeoElIndex == -1) {
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&phi,2,1);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&dPhiDxi,1,2);
    pztopology::TPZLine::TShape<Fad<double>>
              (xiInterior,&phi.super_TPZFMatrix<Fad<double>_>,
               &dPhiDxi.super_TPZFMatrix<Fad<double>_>);
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fRow = (ulong)dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                  super_TPZBaseMatrix.fRow._4_4_ << 0x20;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fCol = 0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    _26_6_ = 0;
    TPZFNMatrix<45,_Fad<double>_>::TPZFNMatrix(&gradXLin,3,1,(Fad<double> *)&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&dCorrFactorDxi);
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()(coord,lVar6,lVar5);
        dVar1 = *pdVar3;
        dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix._24_8_ =
             TPZFMatrix<Fad<double>_>::operator()(&dPhiDxi.super_TPZFMatrix<Fad<double>_>,0,lVar5);
        dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix.fCol = 0;
        dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix.fRow = (int64_t)dVar1;
        pFVar4 = TPZFMatrix<Fad<double>_>::operator()
                           (&gradXLin.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        Fad<double>::operator+=
                  (pFVar4,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&dCorrFactorDxi);
      }
    }
    for (lVar5 = 0; lVar5 < (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 < (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
          lVar6 = lVar6 + 1) {
        pFVar4 = TPZFMatrix<Fad<double>_>::operator()
                           (&gradXLin.super_TPZFMatrix<Fad<double>_>,lVar5,lVar6);
        this_00 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar5,lVar6);
        Fad<double>::operator=(this_00,pFVar4);
      }
    }
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,3,1,(Fad<double> *)&linearSideMappings);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (&gradNonLinSideVec,1,&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,3,1,(Fad<double> *)&linearSideMappings);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (&gradLinSideVec,1,&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fRow = dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow & 0xffffffff00000000;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fCol = 0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    _26_6_ = 0;
    TPZManVector<Fad<double>,_20>::TPZManVector(&blendFactor,1,(Fad<double> *)&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&dCorrFactorDxi);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,1,1,(Fad<double> *)&linearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&linearSideMappings,1,3,(Fad<double> *)&nonLinearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&nonLinearSideMappings);
    local_1950.val_ = 0.0;
    local_1950.dx_.num_elts = 0;
    local_1950.dx_.ptr_to_data = (double *)0x0;
    local_1950.defaultVal = 0.0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix(&nonLinearSideMappings,1,3,&local_1950);
    Fad<double>::~Fad(&local_1950);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    TPZManVector<Fad<double>,_20>::~TPZManVector(&blendFactor);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec(&gradLinSideVec);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec(&gradNonLinSideVec);
    TPZFNMatrix<45,_Fad<double>_>::~TPZFNMatrix(&gradXLin);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dPhiDxi);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&linearSideMappings,0);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&gradXLin);
    bVar2 = MapToNeighSide<Fad<double>>
                      (this,2,1,xiInterior,(TPZVec<Fad<double>_> *)&linearSideMappings,
                       &gradXLin.super_TPZFMatrix<Fad<double>_>);
    if (!bVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x80);
    }
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&dCorrFactorDxi);
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&nonLinearSideMappings,this->fNeighbours,mesh);
    TPZGeoElSide::GradX((TPZGeoElSide *)&nonLinearSideMappings,
                        (TPZVec<Fad<double>_> *)&linearSideMappings,
                        &dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZMatrix<Fad<double>_>::Multiply
              ((TPZMatrix<Fad<double>_> *)&dCorrFactorDxi,&gradXLin.super_TPZFMatrix<Fad<double>_>,
               gradx,0);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&dCorrFactorDxi);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&gradXLin);
    TPZManVector<Fad<double>,_3>::~TPZManVector((TPZManVector<Fad<double>,_3> *)&linearSideMappings)
    ;
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}